

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O0

SecretKey * jbcoin::generateSecretKey(SecretKey *__return_storage_ptr__,KeyType type,Seed *seed)

{
  uint32_t *this;
  uint8_t *puVar1;
  size_t sVar2;
  pointer pvVar3;
  const_pointer data;
  allocator local_d9;
  string local_d8;
  Slice local_b8;
  undefined1 local_a5;
  undefined1 local_a4 [8];
  uint256 upk;
  uint128 ps;
  Slice local_68;
  undefined1 local_51;
  Slice local_50;
  undefined1 local_40 [8];
  result_type key;
  Seed *seed_local;
  KeyType type_local;
  SecretKey *sk;
  
  key.pn._24_8_ = seed;
  if (type == ed25519) {
    puVar1 = Seed::data(seed);
    sVar2 = Seed::size((Seed *)key.pn._24_8_);
    Slice::Slice(&local_50,puVar1,sVar2);
    sha512Half_s<jbcoin::Slice>((result_type *)local_40,&local_50);
    local_51 = 0;
    pvVar3 = base_uint<256UL,_void>::data((result_type *)local_40);
    sVar2 = base_uint<256UL,_void>::size();
    Slice::Slice(&local_68,pvVar3,sVar2);
    SecretKey::SecretKey(__return_storage_ptr__,&local_68);
    pvVar3 = base_uint<256UL,_void>::data((result_type *)local_40);
    sVar2 = base_uint<256UL,_void>::size();
    beast::secure_erase<void>(pvVar3,sVar2);
  }
  else {
    if (type != secp256k1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d8,"generateSecretKey: unknown key type",&local_d9);
      LogicError(&local_d8);
    }
    this = upk.pn + 6;
    base_uint<128UL,_void>::base_uint((base_uint<128UL,_void> *)this);
    pvVar3 = base_uint<128UL,_void>::data((base_uint<128UL,_void> *)this);
    puVar1 = Seed::data((Seed *)key.pn._24_8_);
    sVar2 = Seed::size((Seed *)key.pn._24_8_);
    memcpy(pvVar3,puVar1,sVar2);
    generateRootDeterministicPrivateKey((uint256 *)local_a4,(uint128 *)this);
    local_a5 = 0;
    data = base_uint<256UL,_void>::data((uint256 *)local_a4);
    sVar2 = base_uint<256UL,_void>::size();
    Slice::Slice(&local_b8,data,sVar2);
    SecretKey::SecretKey(__return_storage_ptr__,&local_b8);
    pvVar3 = base_uint<128UL,_void>::data((base_uint<128UL,_void> *)this);
    sVar2 = base_uint<128UL,_void>::size();
    beast::secure_erase<void>(pvVar3,sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

SecretKey
generateSecretKey (KeyType type, Seed const& seed)
{
    if (type == KeyType::ed25519)
    {
        auto key = sha512Half_s(Slice(
            seed.data(), seed.size()));
        SecretKey sk = Slice{ key.data(), key.size() };
        beast::secure_erase(key.data(), key.size());
        return sk;
    }

    if (type == KeyType::secp256k1)
    {
        // FIXME: Avoid copying the seed into a uint128 key only to have
        //        generateRootDeterministicPrivateKey copy out of it.
        uint128 ps;
        std::memcpy(ps.data(),
            seed.data(), seed.size());
        auto const upk =
            generateRootDeterministicPrivateKey(ps);
        SecretKey sk = Slice{ upk.data(), upk.size() };
        beast::secure_erase(ps.data(), ps.size());
        return sk;
    }

    LogicError ("generateSecretKey: unknown key type");
}